

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampBase.cpp
# Opt level: O2

void __thiscall glcts::TextureBorderClampBase::deinitAllTextures(TextureBorderClampBase *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0xb8))(0xde1,0);
  (**(code **)(lVar2 + 0xb8))(0x806f,0);
  (**(code **)(lVar2 + 0xb8))(0x8c1a,0);
  (**(code **)(lVar2 + 0xb8))(0x8513,0);
  if ((this->super_TestCaseBase).m_is_texture_storage_multisample_supported == true) {
    (**(code **)(lVar2 + 0xb8))(0x9100,0);
  }
  if ((this->super_TestCaseBase).m_is_texture_storage_multisample_2d_array_supported == true) {
    (**(code **)(lVar2 + 0xb8))(0x9102,0);
  }
  if ((this->super_TestCaseBase).m_is_texture_cube_map_array_supported == true) {
    (**(code **)(lVar2 + 0xb8))(0x9009,0);
  }
  if ((this->super_TestCaseBase).m_is_texture_buffer_supported == true) {
    (**(code **)(lVar2 + 0x40))((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0);
  }
  if (this->m_texture_2D_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_texture_2D_id);
    this->m_texture_2D_id = 0;
  }
  if (this->m_texture_3D_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_texture_3D_id);
    this->m_texture_3D_id = 0;
  }
  if (this->m_texture_2D_array_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_texture_2D_array_id);
    this->m_texture_2D_array_id = 0;
  }
  if (this->m_texture_cube_map_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_texture_cube_map_id);
    this->m_texture_cube_map_id = 0;
  }
  if (this->m_texture_cube_map_array_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_texture_cube_map_array_id);
    this->m_texture_cube_map_array_id = 0;
  }
  if (this->m_texture_2D_multisample_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_texture_2D_multisample_id);
    this->m_texture_2D_multisample_id = 0;
  }
  if (this->m_texture_2D_multisample_array_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_texture_2D_multisample_array_id);
    this->m_texture_2D_multisample_array_id = 0;
  }
  if (this->m_texture_buffer_id != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_texture_buffer_id);
    this->m_texture_buffer_id = 0;
  }
  return;
}

Assistant:

void TextureBorderClampBase::deinitAllTextures(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.bindTexture(GL_TEXTURE_2D, 0);
	gl.bindTexture(GL_TEXTURE_3D, 0);
	gl.bindTexture(GL_TEXTURE_2D_ARRAY, 0);
	gl.bindTexture(GL_TEXTURE_CUBE_MAP, 0);

	if (m_is_texture_storage_multisample_supported)
	{
		gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, 0);
	}

	if (m_is_texture_storage_multisample_2d_array_supported)
	{
		gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, 0);
	}

	if (m_is_texture_cube_map_array_supported)
	{
		gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, 0);
	}

	if (m_is_texture_buffer_supported)
	{
		gl.bindBuffer(m_glExtTokens.TEXTURE_BUFFER, 0);
	}

	if (0 != m_texture_2D_id)
	{
		gl.deleteTextures(1, &m_texture_2D_id);

		m_texture_2D_id = 0;
	}

	if (0 != m_texture_3D_id)
	{
		gl.deleteTextures(1, &m_texture_3D_id);

		m_texture_3D_id = 0;
	}

	if (0 != m_texture_2D_array_id)
	{
		gl.deleteTextures(1, &m_texture_2D_array_id);

		m_texture_2D_array_id = 0;
	}

	if (0 != m_texture_cube_map_id)
	{
		gl.deleteTextures(1, &m_texture_cube_map_id);

		m_texture_cube_map_id = 0;
	}

	if (0 != m_texture_cube_map_array_id)
	{
		gl.deleteTextures(1, &m_texture_cube_map_array_id);

		m_texture_cube_map_array_id = 0;
	}

	if (0 != m_texture_2D_multisample_id)
	{
		gl.deleteTextures(1, &m_texture_2D_multisample_id);

		m_texture_2D_multisample_id = 0;
	}

	if (0 != m_texture_2D_multisample_array_id)
	{
		gl.deleteTextures(1, &m_texture_2D_multisample_array_id);

		m_texture_2D_multisample_array_id = 0;
	}

	if (0 != m_texture_buffer_id)
	{
		gl.deleteBuffers(1, &m_texture_buffer_id);

		m_texture_buffer_id = 0;
	}
}